

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O2

void __thiscall wasm::Instrumenter::addProfileExport(Instrumenter *this,size_t numFuncs)

{
  StorageKind SVar1;
  Module *pMVar2;
  pointer puVar3;
  size_t sVar4;
  char *pcVar5;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var6;
  undefined1 auVar7 [16];
  __uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *p_Var8;
  undefined1 index [4];
  anon_class_8_1_911e227b aVar9;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var10;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var11;
  Type type;
  Const *pCVar12;
  GlobalGet *value;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var13;
  LocalGet *pLVar14;
  Binary *pBVar15;
  Break *any;
  LocalGet *left;
  Load *value_00;
  Store *pSVar16;
  LocalSet *args;
  Break *args_1;
  Block *pBVar17;
  Loop *first;
  If *left_00;
  Builder BVar18;
  pointer puVar19;
  char *in_RCX;
  pointer puVar20;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  Name *global;
  pointer pNVar21;
  Address AVar22;
  Name name;
  Name value_01;
  Name root;
  Name value_02;
  string_view sVar23;
  Name NVar24;
  Signature SVar25;
  Name NVar26;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  IString local_180;
  HeapType local_170;
  Type local_168;
  Builder local_160;
  size_t profileSize;
  Name loadMemoryName;
  Name local_138;
  Name local_128;
  Name local_118;
  string_view local_108;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  IString local_c8;
  Name local_b8;
  string_view local_a8;
  undefined1 auStack_98 [8];
  anon_class_16_2_22e62c78 profileSizeConst;
  undefined1 local_74 [4];
  anon_class_8_1_911e227b aStack_70;
  Index funcIdxVar;
  anon_class_8_1_911e227b getAddr;
  uint local_5c;
  Store *local_58;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> local_50;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> writeProfile;
  anon_class_16_2_204a708a getFuncIdx;
  Builder builder;
  
  pMVar2 = this->wasm;
  getAddr.builder = (Builder *)numFuncs;
  IString::IString(&local_180,&this->config->profileExport);
  NVar24.super_IString.str._M_str = in_RCX;
  NVar24.super_IString.str._M_len = (size_t)local_180.str._M_str;
  sVar23 = (string_view)
           Names::getValidFunctionName((Names *)pMVar2,(Module *)local_180.str._M_len,NVar24);
  writeProfile._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
  .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x2;
  getFuncIdx.builder = (Builder *)0x2;
  wasm::Type::Type(&local_168,&writeProfile,2);
  SVar25.results.id = 2;
  SVar25.params.id = local_168.id;
  wasm::HeapType::HeapType(&local_170,SVar25);
  auStack_98 = (undefined1  [8])0x0;
  profileSizeConst.builder = (Builder *)0x0;
  profileSizeConst.profileSize = (size_t *)0x0;
  name_00.super_IString.str._M_str = (char *)sVar23._M_len;
  name_00.super_IString.str._M_len = (size_t)&local_50;
  local_a8 = sVar23;
  Builder::makeFunction
            (name_00,(HeapType)sVar23._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_170.id,
             (Expression *)auStack_98);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_98);
  _Var10._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       local_50._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
       super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
  *(bool *)((long)local_50._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x10) = true;
  Name::Name((Name *)&loadMemoryName.super_IString.str._M_str,"addr");
  auVar7._8_8_ = 0;
  auVar7._0_8_ = loadMemoryName.super_IString.str._M_str;
  wasm::Function::setLocalName
            ((uint)_Var10._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
             (Name)(auVar7 << 0x40));
  _Var10._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       local_50._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
       super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
  Name::Name(&local_138,"size");
  NVar26.super_IString.str._M_str = (char *)local_138.super_IString.str._M_len;
  NVar26.super_IString.str._M_len = 1;
  wasm::Function::setLocalName
            ((uint)_Var10._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,NVar26);
  aVar9 = getAddr;
  local_160.wasm = (Module *)((long)getAddr.builder * 4 + 8);
  profileSizeConst.builder = &local_160;
  pMVar2 = this->wasm;
  auStack_98 = (undefined1  [8])&getFuncIdx.funcIdxVar;
  AVar22.addr = (long)getAddr.builder * 4 + 0x10007U >> 0x10;
  puVar3 = (pMVar2->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  aStack_70.builder = (Builder *)auStack_98;
  getFuncIdx.funcIdxVar = (Index *)pMVar2;
  if (puVar3 == (pMVar2->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    Name::Name(&local_128,"0");
    name_01.super_IString.str._M_str = (char *)local_128.super_IString.str._M_len;
    name_01.super_IString.str._M_len = (size_t)&writeProfile;
    Builder::makeMemory(name_01,(Address)local_128.super_IString.str._M_str,(Address)0x0,false,
                        (Type)0x0);
    wasm::Module::addMemory((unique_ptr *)pMVar2);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
              ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&writeProfile);
    _Var11._M_head_impl =
         *(Memory **)
          &(((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>;
    ((_Var11._M_head_impl)->initial).addr = AVar22.addr;
  }
  else {
    _Var11._M_head_impl =
         (puVar3->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if ((AVar22.addr <= ((_Var11._M_head_impl)->initial).addr) ||
       (((_Var11._M_head_impl)->initial).addr = AVar22.addr,
       AVar22.addr <= ((_Var11._M_head_impl)->max).addr)) goto LAB_00123295;
  }
  ((Address *)((long)_Var11._M_head_impl + 0x40))->addr = AVar22.addr;
LAB_00123295:
  type.id = (uintptr_t)
            addProfileExport::anon_class_8_1_911e227b::operator()(&stack0xffffffffffffff90);
  pCVar12 = Builder::makeConst<long>((Builder *)&getFuncIdx.funcIdxVar,this->moduleHash);
  local_5c = 8;
  local_58 = Builder::makeStore((Builder *)&getFuncIdx.funcIdxVar,8,(Address)0x0,1,
                                (Expression *)type.id,(Expression *)pCVar12,(Type)0x3,
                                (Name)*(string_view *)
                                       (((this->wasm->memories).
                                         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                       ._M_t);
  _Var10._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       local_50._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
       super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
  SVar1 = this->config->storageKind;
  if (SVar1 - InMemory < 2) {
    Name::Name(&local_118,"funcIdx");
    name.super_IString.str._M_str = (char *)0x2;
    name.super_IString.str._M_len = (size_t)local_118.super_IString.str._M_str;
    local_74 = (undefined1  [4])
               Builder::addVar((Builder *)
                               _Var10._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                               (Function *)local_118.super_IString.str._M_len,name,type);
    getFuncIdx.builder = (Builder *)local_74;
    if (this->config->storageKind == InMemory) {
      _Var13._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    }
    else {
      _Var13._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_>)&this->secondaryMemory;
    }
    profileSize = *(size_t *)
                   _Var13._M_t.
                   super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    loadMemoryName.super_IString.str._M_len =
         *(undefined8 *)
          ((long)_Var13._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    writeProfile._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         &getFuncIdx.funcIdxVar;
    Name::Name((Name *)&local_108,"outer");
    Name::Name((Name *)&local_f8,"l");
    Name::Name((Name *)&local_e8,"outer");
    pLVar14 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)&writeProfile);
    pCVar12 = Builder::makeConst<unsigned_int>
                        ((Builder *)&getFuncIdx.funcIdxVar,(uint)aVar9.builder);
    pBVar15 = Builder::makeBinary((Builder *)&getFuncIdx.funcIdxVar,EqInt32,(Expression *)pLVar14,
                                  (Expression *)pCVar12);
    any = Builder::makeBreak((Builder *)&getFuncIdx.funcIdxVar,(Name)local_e8,(Expression *)0x0,
                             (Expression *)pBVar15);
    pLVar14 = addProfileExport::anon_class_8_1_911e227b::operator()(&stack0xffffffffffffff90);
    left = addProfileExport::anon_class_16_2_204a708a::operator()
                     ((anon_class_16_2_204a708a *)&writeProfile);
    pCVar12 = Builder::makeConst<unsigned_int>((Builder *)&getFuncIdx.funcIdxVar,4);
    pBVar15 = Builder::makeBinary((Builder *)&getFuncIdx.funcIdxVar,MulInt32,(Expression *)left,
                                  (Expression *)pCVar12);
    pBVar15 = Builder::makeBinary((Builder *)&getFuncIdx.funcIdxVar,AddInt32,(Expression *)pLVar14,
                                  (Expression *)pBVar15);
    pLVar14 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)&writeProfile);
    value_00 = MixedArena::alloc<wasm::Load>((MixedArena *)(getFuncIdx.funcIdxVar + 0x56));
    value_00->bytes = '\x01';
    value_00->signed_ = false;
    (value_00->offset).addr = 0;
    (value_00->align).addr = 1;
    value_00->ptr = (Expression *)pLVar14;
    (value_00->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    (value_00->memory).super_IString.str._M_len = profileSize;
    (value_00->memory).super_IString.str._M_str = (char *)loadMemoryName.super_IString.str._M_len;
    value_00->isAtomic = true;
    pSVar16 = Builder::makeStore((Builder *)&getFuncIdx.funcIdxVar,4,(Address)0x8,4,
                                 (Expression *)pBVar15,(Expression *)value_00,(Type)0x2,
                                 (Name)*(string_view *)
                                        (((this->wasm->memories).
                                          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                        ._M_t);
    index = local_74;
    pLVar14 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)&writeProfile);
    pCVar12 = Builder::makeConst<unsigned_int>((Builder *)&getFuncIdx.funcIdxVar,1);
    pBVar15 = Builder::makeBinary((Builder *)&getFuncIdx.funcIdxVar,AddInt32,(Expression *)pLVar14,
                                  (Expression *)pCVar12);
    args = Builder::makeLocalSet
                     ((Builder *)&getFuncIdx.funcIdxVar,(Index)index,(Expression *)pBVar15);
    Name::Name((Name *)&local_d8,"l");
    args_1 = Builder::makeBreak((Builder *)&getFuncIdx.funcIdxVar,(Name)local_d8,(Expression *)0x0,
                                (Expression *)0x0);
    pBVar17 = Builder::blockify<wasm::LocalSet*,wasm::Break*>
                        ((Builder *)&getFuncIdx.funcIdxVar,(Expression *)any,(Expression *)pSVar16,
                         args,args_1);
    first = Builder::makeLoop((Builder *)&getFuncIdx.funcIdxVar,(Name)local_f8,(Expression *)pBVar17
                             );
    pBVar17 = Builder::makeBlock((Builder *)&getFuncIdx.funcIdxVar,(Name)local_108,
                                 (Expression *)first);
    local_58 = (Store *)Builder::blockify((Builder *)&getFuncIdx.funcIdxVar,(Expression *)local_58,
                                          (Expression *)pBVar17);
  }
  else if (SVar1 == InGlobals) {
    getAddr.builder =
         (Builder *)
         (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
         .super__Vector_impl_data._M_finish;
    for (pNVar21 = (this->functionGlobals).
                   super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start; pNVar21 != (pointer)getAddr.builder;
        pNVar21 = pNVar21 + 1) {
      pLVar14 = addProfileExport::anon_class_8_1_911e227b::operator()(&stack0xffffffffffffff90);
      sVar4 = (pNVar21->super_IString).str._M_len;
      pcVar5 = (pNVar21->super_IString).str._M_str;
      value = MixedArena::alloc<wasm::GlobalGet>((MixedArena *)(getFuncIdx.funcIdxVar + 0x56));
      AVar22.addr._4_4_ = 0;
      AVar22.addr._0_4_ = local_5c;
      (value->name).super_IString.str._M_len = sVar4;
      (value->name).super_IString.str._M_str = pcVar5;
      (value->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id = 2;
      pSVar16 = Builder::makeStore((Builder *)&getFuncIdx.funcIdxVar,4,AVar22,1,
                                   (Expression *)pLVar14,(Expression *)value,(Type)0x2,
                                   (Name)*(string_view *)
                                          (((this->wasm->memories).
                                            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                          super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                          ._M_t);
      local_58 = (Store *)Builder::blockify((Builder *)&getFuncIdx.funcIdxVar,(Expression *)local_58
                                            ,(Expression *)pSVar16);
      local_5c = local_5c + 4;
    }
  }
  pLVar14 = Builder::makeLocalGet((Builder *)&getFuncIdx.funcIdxVar,1,(Type)0x2);
  pCVar12 = addProfileExport::anon_class_16_2_22e62c78::operator()
                      ((anon_class_16_2_22e62c78 *)auStack_98);
  pBVar15 = Builder::makeBinary((Builder *)&getFuncIdx.funcIdxVar,GeUInt32,(Expression *)pLVar14,
                                (Expression *)pCVar12);
  left_00 = Builder::makeIf((Builder *)&getFuncIdx.funcIdxVar,(Expression *)pBVar15,
                            (Expression *)local_58,(Expression *)0x0);
  pCVar12 = addProfileExport::anon_class_16_2_22e62c78::operator()
                      ((anon_class_16_2_22e62c78 *)auStack_98);
  BVar18.wasm = (Module *)
                Builder::makeSequence
                          ((Builder *)&getFuncIdx.funcIdxVar,(Expression *)left_00,
                           (Expression *)pCVar12);
  *(Module **)
   ((long)local_50._M_t.
          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x60) = BVar18.wasm;
  wasm::Module::addFunction((unique_ptr *)this->wasm);
  pMVar2 = this->wasm;
  IString::IString(&local_c8,&this->config->profileExport);
  value_01.super_IString.str._M_str = (char *)local_a8._M_len;
  value_01.super_IString.str._M_len = (size_t)local_c8.str._M_str;
  name_02.super_IString.str._M_str = (char *)local_c8.str._M_len;
  name_02.super_IString.str._M_len = (size_t)&writeProfile;
  Builder::makeExport(name_02,value_01,(ExternalKind)local_a8._M_str);
  wasm::Module::addExport((unique_ptr *)pMVar2);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
            ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&writeProfile);
  pMVar2 = this->wasm;
  if (*(long *)((long)(((pMVar2->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x20
               ) == 0) {
    puVar19 = (pMVar2->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar20 = (pMVar2->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (puVar19 == puVar20) {
        Name::Name(&local_b8,"profile-memory");
        _Var6.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
             (((this->wasm->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
        root.super_IString.str._M_str = (char *)puVar20;
        root.super_IString.str._M_len =
             *(size_t *)
              ((long)_Var6.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                     _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                     .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
        NVar24 = Names::getValidExportName
                           ((Names *)this->wasm,
                            *(Module **)
                             _Var6.
                             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,root);
        value_02.super_IString.str._M_str = NVar24.super_IString.str._M_len;
        value_02.super_IString.str._M_len = (size_t)local_b8.super_IString.str._M_str;
        name_03.super_IString.str._M_str = (char *)local_b8.super_IString.str._M_len;
        name_03.super_IString.str._M_len = (size_t)&writeProfile;
        Builder::makeExport(name_03,value_02,(ExternalKind)NVar24.super_IString.str._M_str);
        wasm::Module::addExport((unique_ptr *)pMVar2);
        std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                  ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&writeProfile);
        break;
      }
      p_Var8 = &puVar19->_M_t;
      puVar19 = puVar19 + 1;
    } while (((p_Var8->super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t
              .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind != Memory);
  }
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_50);
  return;
}

Assistant:

void Instrumenter::addProfileExport(size_t numFuncs) {
  // Create and export a function to dump the profile into a given memory
  // buffer. The function takes the available address and buffer size as
  // arguments and returns the total size of the profile. It only actually
  // writes the profile if the given space is sufficient to hold it.
  auto name = Names::getValidFunctionName(*wasm, config.profileExport);
  auto writeProfile = Builder::makeFunction(
    name, Signature({Type::i32, Type::i32}, Type::i32), {});
  writeProfile->hasExplicitName = true;
  writeProfile->setLocalName(0, "addr");
  writeProfile->setLocalName(1, "size");

  // Calculate the size of the profile:
  //   8 bytes module hash +
  //   4 bytes for the timestamp for each function
  const size_t profileSize = 8 + 4 * numFuncs;

  // Create the function body
  Builder builder(*wasm);
  auto getAddr = [&]() { return builder.makeLocalGet(0, Type::i32); };
  auto getSize = [&]() { return builder.makeLocalGet(1, Type::i32); };
  auto hashConst = [&]() { return builder.makeConst(int64_t(moduleHash)); };
  auto profileSizeConst = [&]() {
    return builder.makeConst(int32_t(profileSize));
  };

  // Also make sure there is a memory with enough pages to write into
  size_t pages = (profileSize + Memory::kPageSize - 1) / Memory::kPageSize;
  if (wasm->memories.empty()) {
    wasm->addMemory(Builder::makeMemory("0"));
    wasm->memories[0]->initial = pages;
    wasm->memories[0]->max = pages;
  } else if (wasm->memories[0]->initial < pages) {
    wasm->memories[0]->initial = pages;
    if (wasm->memories[0]->max < pages) {
      wasm->memories[0]->max = pages;
    }
  }

  // Write the hash followed by all the time stamps
  Expression* writeData = builder.makeStore(
    8, 0, 1, getAddr(), hashConst(), Type::i64, wasm->memories[0]->name);
  uint32_t offset = 8;

  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      for (const auto& global : functionGlobals) {
        writeData = builder.blockify(
          writeData,
          builder.makeStore(4,
                            offset,
                            1,
                            getAddr(),
                            builder.makeGlobalGet(global, Type::i32),
                            Type::i32,
                            wasm->memories[0]->name));
        offset += 4;
      }
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      Index funcIdxVar =
        Builder::addVar(writeProfile.get(), "funcIdx", Type::i32);
      auto getFuncIdx = [&]() {
        return builder.makeLocalGet(funcIdxVar, Type::i32);
      };
      Name loadMemoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      // (block $outer
      //   (loop $l
      //     (br_if $outer (i32.eq (local.get $fucIdx) (i32.const numFuncs))
      //     (i32.store offset=8
      //       (i32.add
      //         (local.get $addr)
      //         (i32.mul (local.get $funcIdx) (i32.const 4))
      //       )
      //       (i32.atomic.load8_u (local.get $funcIdx))
      //     )
      //     (local.set $funcIdx
      //      (i32.add (local.get $fundIdx) (i32.const 1)
      //     )
      //     (br $l)
      //   )
      // )
      writeData = builder.blockify(
        writeData,
        builder.makeBlock(
          "outer",
          builder.makeLoop(
            "l",
            builder.blockify(
              builder.makeBreak(
                "outer",
                nullptr,
                builder.makeBinary(EqInt32,
                                   getFuncIdx(),
                                   builder.makeConst(uint32_t(numFuncs)))),
              builder.makeStore(
                4,
                offset,
                4,
                builder.makeBinary(
                  AddInt32,
                  getAddr(),
                  builder.makeBinary(
                    MulInt32, getFuncIdx(), builder.makeConst(uint32_t(4)))),
                builder.makeAtomicLoad(
                  1, 0, getFuncIdx(), Type::i32, loadMemoryName),
                Type::i32,
                wasm->memories[0]->name),
              builder.makeLocalSet(
                funcIdxVar,
                builder.makeBinary(
                  AddInt32, getFuncIdx(), builder.makeConst(uint32_t(1)))),
              builder.makeBreak("l")))));
      break;
    }
  }

  writeProfile->body = builder.makeSequence(
    builder.makeIf(builder.makeBinary(GeUInt32, getSize(), profileSizeConst()),
                   writeData),
    profileSizeConst());

  // Create an export for the function
  wasm->addFunction(std::move(writeProfile));
  wasm->addExport(
    Builder::makeExport(config.profileExport, name, ExternalKind::Function));

  // Export the memory if it is not already exported or imported.
  if (!wasm->memories[0]->imported()) {
    bool memoryExported = false;
    for (auto& ex : wasm->exports) {
      if (ex->kind == ExternalKind::Memory) {
        memoryExported = true;
        break;
      }
    }
    if (!memoryExported) {
      wasm->addExport(Builder::makeExport(
        "profile-memory",
        Names::getValidExportName(*wasm, wasm->memories[0]->name),
        ExternalKind::Memory));
    }
  }
}